

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_ref_pic_list_reordering(h264_stream_t *h,bs_t *b)

{
  int *piVar1;
  int *piVar2;
  slice_header_t *psVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  bool bVar16;
  
  psVar3 = h->sh;
  iVar13 = psVar3->slice_type;
  iVar6 = iVar13 + -5;
  iVar9 = iVar13;
  if (4 < iVar13) {
    iVar9 = iVar6;
  }
  if ((iVar9 != 2) && (iVar9 != 4)) {
    uVar11 = b->bits_left - 1;
    b->bits_left = uVar11;
    pbVar10 = b->p;
    pbVar4 = b->end;
    uVar7 = 0;
    if (pbVar10 < pbVar4) {
      uVar7 = (uint)((*pbVar10 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
    }
    (psVar3->rplr).ref_pic_list_reordering_flag_l0 = uVar7;
    if (uVar7 != 0) {
      piVar1 = (psVar3->rplr).reorder_l0.long_term_pic_num;
      piVar2 = (psVar3->rplr).reorder_l0.abs_diff_pic_num_minus1;
      lVar12 = -1;
      do {
        uVar7 = b->bits_left;
        uVar11 = 0xffffffff;
        iVar6 = -2;
        do {
          iVar13 = iVar6;
          uVar5 = uVar11;
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          bVar16 = true;
          if (pbVar10 < pbVar4) {
            bVar16 = (*pbVar10 >> (uVar7 & 0x1f) & 1) == 0;
          }
          if (uVar7 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar11 = uVar5 + 1;
        } while (((bool)(bVar16 & uVar11 < 0x20)) && (iVar6 = iVar13 + 1, pbVar10 < pbVar4));
        uVar8 = 0;
        if (uVar11 != 0) {
          do {
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            uVar15 = 0;
            if (pbVar10 < pbVar4) {
              uVar15 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
            }
            if (uVar7 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar8 = uVar8 | uVar15 << ((byte)uVar5 & 0x1f);
            uVar5 = uVar5 - 1;
            iVar13 = iVar13 + -1;
          } while (iVar13 != -2);
        }
        uVar8 = ~(-1 << ((byte)uVar11 & 0x1f)) + uVar8;
        (psVar3->rplr).reorder_l0.reordering_of_pic_nums_idc[lVar12 + 1] = uVar8;
        if (uVar8 < 2) {
          uVar7 = b->bits_left;
          uVar11 = 0xffffffff;
          iVar6 = -2;
          do {
            iVar13 = iVar6;
            uVar5 = uVar11;
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            bVar16 = true;
            if (pbVar10 < pbVar4) {
              bVar16 = (*pbVar10 >> (uVar7 & 0x1f) & 1) == 0;
            }
            if (uVar7 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar11 = uVar5 + 1;
          } while (((bool)(bVar16 & uVar11 < 0x20)) && (iVar6 = iVar13 + 1, pbVar10 < pbVar4));
          uVar8 = 0;
          piVar14 = piVar2;
          if (uVar11 != 0) {
            do {
              uVar7 = uVar7 - 1;
              b->bits_left = uVar7;
              uVar15 = 0;
              if (pbVar10 < pbVar4) {
                uVar15 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
              }
              if (uVar7 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar7 = 8;
              }
              uVar8 = uVar8 | uVar15 << ((byte)uVar5 & 0x1f);
              uVar5 = uVar5 - 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != -2);
          }
LAB_00129e67:
          piVar14[lVar12 + 1] = ~(-1 << ((byte)uVar11 & 0x1f)) + uVar8;
          uVar8 = (psVar3->rplr).reorder_l0.reordering_of_pic_nums_idc[lVar12 + 1];
        }
        else if (uVar8 == 2) {
          uVar7 = b->bits_left;
          uVar11 = 0xffffffff;
          iVar6 = -2;
          do {
            iVar13 = iVar6;
            uVar5 = uVar11;
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            bVar16 = true;
            if (pbVar10 < pbVar4) {
              bVar16 = (*pbVar10 >> (uVar7 & 0x1f) & 1) == 0;
            }
            if (uVar7 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar11 = uVar5 + 1;
          } while (((bool)(bVar16 & uVar11 < 0x20)) && (iVar6 = iVar13 + 1, pbVar10 < pbVar4));
          uVar8 = 0;
          piVar14 = piVar1;
          if (uVar11 != 0) {
            do {
              uVar7 = uVar7 - 1;
              b->bits_left = uVar7;
              uVar15 = 0;
              if (pbVar10 < pbVar4) {
                uVar15 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
              }
              if (uVar7 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar7 = 8;
              }
              uVar8 = uVar8 | uVar15 << ((byte)uVar5 & 0x1f);
              uVar5 = uVar5 - 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != -2);
          }
          goto LAB_00129e67;
        }
      } while ((uVar8 != 3) && (lVar12 = lVar12 + 1, pbVar10 < pbVar4));
      iVar13 = psVar3->slice_type;
      iVar6 = iVar13 + -5;
    }
  }
  if (iVar13 < 5) {
    iVar6 = iVar13;
  }
  if (iVar6 == 1) {
    uVar11 = b->bits_left - 1;
    b->bits_left = uVar11;
    pbVar10 = b->p;
    pbVar4 = b->end;
    uVar7 = 0;
    if (pbVar10 < pbVar4) {
      uVar7 = (uint)((*pbVar10 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar10 = pbVar10 + 1;
      b->p = pbVar10;
      b->bits_left = 8;
    }
    (psVar3->rplr).ref_pic_list_reordering_flag_l1 = uVar7;
    if (uVar7 != 0) {
      piVar1 = (psVar3->rplr).reorder_l1.long_term_pic_num;
      piVar2 = (psVar3->rplr).reorder_l1.abs_diff_pic_num_minus1;
      lVar12 = -1;
      do {
        uVar7 = b->bits_left;
        uVar11 = 0xffffffff;
        iVar6 = -2;
        do {
          iVar13 = iVar6;
          uVar5 = uVar11;
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          bVar16 = true;
          if (pbVar10 < pbVar4) {
            bVar16 = (*pbVar10 >> (uVar7 & 0x1f) & 1) == 0;
          }
          if (uVar7 == 0) {
            pbVar10 = pbVar10 + 1;
            b->p = pbVar10;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar11 = uVar5 + 1;
        } while (((bool)(bVar16 & uVar11 < 0x20)) && (iVar6 = iVar13 + 1, pbVar10 < pbVar4));
        uVar8 = 0;
        if (uVar11 != 0) {
          do {
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            uVar15 = 0;
            if (pbVar10 < pbVar4) {
              uVar15 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
            }
            if (uVar7 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar8 = uVar8 | uVar15 << ((byte)uVar5 & 0x1f);
            uVar5 = uVar5 - 1;
            iVar13 = iVar13 + -1;
          } while (iVar13 != -2);
        }
        uVar8 = ~(-1 << ((byte)uVar11 & 0x1f)) + uVar8;
        (psVar3->rplr).reorder_l1.reordering_of_pic_nums_idc[lVar12 + 1] = uVar8;
        if (uVar8 < 2) {
          uVar7 = b->bits_left;
          uVar11 = 0xffffffff;
          iVar6 = -2;
          do {
            iVar13 = iVar6;
            uVar5 = uVar11;
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            bVar16 = true;
            if (pbVar10 < pbVar4) {
              bVar16 = (*pbVar10 >> (uVar7 & 0x1f) & 1) == 0;
            }
            if (uVar7 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar11 = uVar5 + 1;
          } while (((bool)(bVar16 & uVar11 < 0x20)) && (iVar6 = iVar13 + 1, pbVar10 < pbVar4));
          uVar8 = 0;
          piVar14 = piVar2;
          if (uVar11 != 0) {
            do {
              uVar7 = uVar7 - 1;
              b->bits_left = uVar7;
              uVar15 = 0;
              if (pbVar10 < pbVar4) {
                uVar15 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
              }
              if (uVar7 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar7 = 8;
              }
              uVar8 = uVar8 | uVar15 << ((byte)uVar5 & 0x1f);
              uVar5 = uVar5 - 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != -2);
          }
LAB_0012a123:
          piVar14[lVar12 + 1] = ~(-1 << ((byte)uVar11 & 0x1f)) + uVar8;
          uVar8 = (psVar3->rplr).reorder_l1.reordering_of_pic_nums_idc[lVar12 + 1];
        }
        else if (uVar8 == 2) {
          uVar7 = b->bits_left;
          uVar11 = 0xffffffff;
          iVar6 = -2;
          do {
            iVar13 = iVar6;
            uVar5 = uVar11;
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            bVar16 = true;
            if (pbVar10 < pbVar4) {
              bVar16 = (*pbVar10 >> (uVar7 & 0x1f) & 1) == 0;
            }
            if (uVar7 == 0) {
              pbVar10 = pbVar10 + 1;
              b->p = pbVar10;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar11 = uVar5 + 1;
          } while (((bool)(bVar16 & uVar11 < 0x20)) && (iVar6 = iVar13 + 1, pbVar10 < pbVar4));
          uVar8 = 0;
          piVar14 = piVar1;
          if (uVar11 != 0) {
            do {
              uVar7 = uVar7 - 1;
              b->bits_left = uVar7;
              uVar15 = 0;
              if (pbVar10 < pbVar4) {
                uVar15 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
              }
              if (uVar7 == 0) {
                pbVar10 = pbVar10 + 1;
                b->p = pbVar10;
                b->bits_left = 8;
                uVar7 = 8;
              }
              uVar8 = uVar8 | uVar15 << ((byte)uVar5 & 0x1f);
              uVar5 = uVar5 - 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != -2);
          }
          goto LAB_0012a123;
        }
      } while ((uVar8 != 3) && (lVar12 = lVar12 + 1, pbVar10 < pbVar4));
    }
  }
  return;
}

Assistant:

void read_ref_pic_list_reordering(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l0 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l0 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l0.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l0.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l1 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l1 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l1.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l1.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
}